

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuHeapS.c
# Opt level: O0

void Fxu_HeapSingleUpdate(Fxu_HeapSingle *p,Fxu_Single *pSingle)

{
  Fxu_Single *pSingle_local;
  Fxu_HeapSingle *p_local;
  
  if ((0 < pSingle->HNum) && (pSingle->HNum <= p->nItemsAlloc)) {
    if ((pSingle->HNum < 2) || (pSingle->Weight <= p->pTree[pSingle->HNum >> 1]->Weight)) {
      if ((p->nItems < pSingle->HNum * 2) ||
         (p->pTree[pSingle->HNum << 1]->Weight <= pSingle->Weight)) {
        if ((pSingle->HNum * 2 + 1 <= p->nItems) &&
           (pSingle->Weight < p->pTree[pSingle->HNum * 2 + 1]->Weight)) {
          Fxu_HeapSingleMoveDn(p,pSingle);
        }
      }
      else {
        Fxu_HeapSingleMoveDn(p,pSingle);
      }
    }
    else {
      Fxu_HeapSingleMoveUp(p,pSingle);
    }
    return;
  }
  __assert_fail("(pSingle)->HNum >= 1 && (pSingle)->HNum <= p->nItemsAlloc",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/fxu/fxuHeapS.c"
                ,0xe4,"void Fxu_HeapSingleUpdate(Fxu_HeapSingle *, Fxu_Single *)");
}

Assistant:

void Fxu_HeapSingleUpdate( Fxu_HeapSingle * p, Fxu_Single * pSingle )
{
    FXU_HEAP_SINGLE_ASSERT(p,pSingle);
    if ( FXU_HEAP_SINGLE_PARENT_EXISTS(p,pSingle) && 
         FXU_HEAP_SINGLE_WEIGHT(pSingle) > FXU_HEAP_SINGLE_WEIGHT( FXU_HEAP_SINGLE_PARENT(p,pSingle) ) )
        Fxu_HeapSingleMoveUp( p, pSingle );
    else if ( FXU_HEAP_SINGLE_CHILD1_EXISTS(p,pSingle) && 
        FXU_HEAP_SINGLE_WEIGHT(pSingle) < FXU_HEAP_SINGLE_WEIGHT( FXU_HEAP_SINGLE_CHILD1(p,pSingle) ) )
        Fxu_HeapSingleMoveDn( p, pSingle );
    else if ( FXU_HEAP_SINGLE_CHILD2_EXISTS(p,pSingle) && 
        FXU_HEAP_SINGLE_WEIGHT(pSingle) < FXU_HEAP_SINGLE_WEIGHT( FXU_HEAP_SINGLE_CHILD2(p,pSingle) ) )
        Fxu_HeapSingleMoveDn( p, pSingle );
}